

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O0

void GPU_MatrixOrtho(float *result,float left,float right,float bottom,float top,float z_near,
                    float z_far)

{
  float local_68 [2];
  float A [16];
  float z_far_local;
  float z_near_local;
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  float *result_local;
  
  if (result != (float *)0x0) {
    local_68[0] = 2.0 / (right - left);
    local_68[1] = 0.0;
    A[0] = 0.0;
    A[1] = 0.0;
    A[2] = 0.0;
    A[3] = 2.0 / (top - bottom);
    A[4] = 0.0;
    A[5] = 0.0;
    A[6] = 0.0;
    A[7] = 0.0;
    A[8] = -2.0 / (z_far - z_near);
    A[9] = 0.0;
    A[10] = -(right + left) / (right - left);
    A[0xb] = -(top + bottom) / (top - bottom);
    A[0xc] = -(z_far + z_near) / (z_far - z_near);
    A[0xd] = 1.0;
    A[0xe] = z_far;
    A[0xf] = z_near;
    GPU_MultiplyAndAssign(result,local_68);
  }
  return;
}

Assistant:

void GPU_MatrixOrtho(float* result, float left, float right, float bottom, float top, float z_near, float z_far)
{
    if(result == NULL)
		return;

	{
#ifdef ROW_MAJOR
		float A[16];
		FILL_MATRIX_4x4(A,
				2/(right - left), 0,  0, -(right + left)/(right - left),
				0, 2/(top - bottom), 0, -(top + bottom)/(top - bottom),
				0, 0, -2/(z_far - z_near), -(z_far + z_near)/(z_far - z_near),
				0, 0, 0, 1
			);
#else
		float A[16];
		FILL_MATRIX_4x4(A,
				2 / (right - left), 0, 0, 0,
				0, 2 / (top - bottom), 0, 0,
				0, 0, -2 / (z_far - z_near), 0,
				-(right + left) / (right - left), -(top + bottom) / (top - bottom), -(z_far + z_near) / (z_far - z_near), 1
			);
#endif

		GPU_MultiplyAndAssign(result, A);
	}
}